

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lrn.cpp
# Opt level: O1

int __thiscall ncnn::LRN::forward_inplace(LRN *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  uint _c;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  int *piVar6;
  pointer piVar7;
  uint uVar8;
  int iVar9;
  void *pvVar10;
  int iVar11;
  long lVar12;
  uint uVar13;
  int iVar14;
  void *pvVar15;
  long lVar16;
  int iVar17;
  long lVar18;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  uint uVar22;
  uint uVar23;
  void *pvVar24;
  ulong uVar25;
  int iVar26;
  bool bVar27;
  float fVar28;
  ulong local_188;
  allocator_type local_179;
  ulong local_178;
  ulong local_170;
  Mat square_sum;
  Mat square_blob;
  vector<int,_std::allocator<int>_> _space_ofs;
  
  uVar23 = bottom_top_blob->w;
  local_178 = (ulong)(uint)bottom_top_blob->h;
  _c = bottom_top_blob->c;
  uVar25 = (ulong)_c;
  sVar3 = bottom_top_blob->elemsize;
  square_blob.cstep = 0;
  square_blob.data = (void *)0x0;
  square_blob.refcount._0_4_ = 0;
  square_blob.refcount._4_4_ = 0;
  square_blob.elemsize._0_4_ = 0;
  square_blob.elemsize._4_4_ = 0;
  square_blob.elempack = 0;
  square_blob.allocator = (Allocator *)0x0;
  square_blob.dims = 0;
  square_blob.w = 0;
  square_blob.h = 0;
  square_blob.d = 0;
  square_blob.c = 0;
  Mat::create(&square_blob,uVar23,bottom_top_blob->h,_c,sVar3,opt->workspace_allocator);
  iVar26 = -100;
  if ((square_blob.data == (void *)0x0) || ((long)square_blob.c * square_blob.cstep == 0))
  goto LAB_001f516d;
  uVar22 = (int)local_178 * uVar23;
  if (0 < (int)_c) {
    pvVar10 = bottom_top_blob->data;
    sVar4 = bottom_top_blob->cstep;
    sVar5 = bottom_top_blob->elemsize;
    uVar20 = 0;
    pvVar15 = square_blob.data;
    do {
      if (0 < (int)uVar22) {
        uVar21 = 0;
        do {
          fVar1 = *(float *)((long)pvVar10 + uVar21 * 4);
          *(float *)((long)pvVar15 + uVar21 * 4) = fVar1 * fVar1;
          uVar21 = uVar21 + 1;
        } while (uVar22 != uVar21);
      }
      uVar20 = uVar20 + 1;
      pvVar15 = (void *)((long)pvVar15 +
                        square_blob.cstep *
                        CONCAT44(square_blob.elemsize._4_4_,(undefined4)square_blob.elemsize));
      pvVar10 = (void *)((long)pvVar10 + sVar4 * sVar5);
    } while (uVar20 != uVar25);
  }
  if (this->region_type == 0) {
    square_sum.cstep = 0;
    square_sum.data = (void *)0x0;
    square_sum.refcount._0_4_ = 0;
    square_sum.refcount._4_4_ = 0;
    square_sum.elemsize._0_4_ = 0;
    square_sum.elemsize._4_4_ = 0;
    square_sum.elempack = 0;
    square_sum.allocator = (Allocator *)0x0;
    square_sum.dims = 0;
    square_sum.w = 0;
    square_sum.h = 0;
    square_sum.d = 0;
    square_sum.c = 0;
    Mat::create(&square_sum,uVar23,(int)local_178,_c,sVar3,opt->workspace_allocator);
    bVar27 = (long)square_sum.c * square_sum.cstep == 0;
    if (square_sum.data == (void *)0x0 || bVar27) {
      piVar6 = (int *)CONCAT44(square_sum.refcount._4_4_,square_sum.refcount._0_4_);
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + -1;
        UNLOCK();
        if (*piVar6 == 0) {
          if (square_sum.allocator == (Allocator *)0x0) {
            if (square_sum.data != (void *)0x0) {
              free(square_sum.data);
            }
          }
          else {
            (*(square_sum.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      goto LAB_001f516d;
    }
    local_170 = CONCAT71(local_170._1_7_,square_sum.data == (void *)0x0 || bVar27);
    if (0 < square_sum.c * (int)square_sum.cstep) {
      memset(square_sum.data,0,(ulong)(uint)(square_sum.c * (int)square_sum.cstep) << 2);
    }
    if (0 < (int)_c) {
      fVar1 = this->alpha;
      iVar26 = this->local_size;
      uVar13 = iVar26 / 2;
      pvVar10 = bottom_top_blob->data;
      sVar3 = bottom_top_blob->cstep;
      local_178 = square_sum.cstep *
                  CONCAT44(square_sum.elemsize._4_4_,(undefined4)square_sum.elemsize);
      sVar4 = bottom_top_blob->elemsize;
      uVar20 = 0;
      pvVar15 = square_sum.data;
      uVar23 = uVar13;
      do {
        uVar8 = (int)uVar20 - uVar13;
        if ((long)(int)uVar8 <= (long)((long)(int)uVar13 + uVar20)) {
          do {
            if ((uVar8 < _c) && (0 < (int)uVar22)) {
              uVar21 = 0;
              do {
                *(float *)((long)pvVar15 + uVar21 * 4) =
                     *(float *)((long)pvVar15 + uVar21 * 4) +
                     *(float *)((long)square_blob.data +
                               uVar21 * 4 +
                               square_blob.cstep *
                               CONCAT44(square_blob.elemsize._4_4_,(undefined4)square_blob.elemsize)
                               * (ulong)uVar8);
                uVar21 = uVar21 + 1;
              } while (uVar22 != uVar21);
            }
            bVar27 = uVar8 != uVar23;
            uVar8 = uVar8 + 1;
          } while (bVar27);
        }
        if (0 < (int)uVar22) {
          uVar21 = 0;
          do {
            fVar28 = powf(*(float *)((long)pvVar15 + uVar21 * 4) * fVar1 * (1.0 / (float)iVar26) +
                          this->bias,-this->beta);
            *(float *)((long)pvVar10 + uVar21 * 4) = fVar28 * *(float *)((long)pvVar10 + uVar21 * 4)
            ;
            uVar21 = uVar21 + 1;
          } while (uVar22 != uVar21);
        }
        uVar23 = uVar23 + 1;
        uVar20 = uVar20 + 1;
        pvVar15 = (void *)((long)pvVar15 + local_178);
        pvVar10 = (void *)((long)pvVar10 + sVar3 * sVar4);
      } while (uVar20 != uVar25);
    }
    piVar6 = (int *)CONCAT44(square_sum.refcount._4_4_,square_sum.refcount._0_4_);
    iVar26 = -100;
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + -1;
      UNLOCK();
      if (*piVar6 == 0) {
        if (square_sum.allocator == (Allocator *)0x0) {
          if (square_sum.data != (void *)0x0) {
            free(square_sum.data);
          }
        }
        else {
          (*(square_sum.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    if ((char)local_170 != '\0') goto LAB_001f516d;
  }
  else if (this->region_type == 1) {
    piVar6 = (int *)CONCAT44(square_blob.refcount._4_4_,square_blob.refcount._0_4_);
    square_sum.data = square_blob.data;
    square_sum.refcount._0_4_ = square_blob.refcount._0_4_;
    square_sum.refcount._4_4_ = square_blob.refcount._4_4_;
    square_sum.elemsize._0_4_ = (undefined4)square_blob.elemsize;
    square_sum.elemsize._4_4_ = square_blob.elemsize._4_4_;
    square_sum.elempack = square_blob.elempack;
    square_sum.allocator = square_blob.allocator;
    square_sum.dims = square_blob.dims;
    square_sum.w = square_blob.w;
    square_sum.h = square_blob.h;
    square_sum.d = square_blob.d;
    square_sum.c = square_blob.c;
    square_sum.cstep = square_blob.cstep;
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + 1;
      UNLOCK();
    }
    uVar22 = this->local_size;
    uVar13 = uVar23;
    if (1 < (int)uVar22) {
      uVar13 = uVar22 >> 1;
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = *(pointer *)opt;
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)opt->workspace_allocator;
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)opt->workspace_allocator;
      copy_make_border(&square_blob,&square_sum,uVar13,~uVar13 + uVar22,uVar13,~uVar13 + uVar22,0,
                       0.0,(Option *)&_space_ofs);
      uVar13 = square_sum.w;
      if (square_sum.data == (void *)0x0 || (long)square_sum.c * square_sum.cstep == 0) {
        piVar6 = (int *)CONCAT44(square_sum.refcount._4_4_,square_sum.refcount._0_4_);
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if (*piVar6 == 0) {
            if (square_sum.allocator == (Allocator *)0x0) {
              if (square_sum.data != (void *)0x0) {
                free(square_sum.data);
              }
            }
            else {
              (*(square_sum.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        square_sum.cstep = 0;
        square_sum.data = (void *)0x0;
        square_sum.refcount._0_4_ = 0;
        square_sum.refcount._4_4_ = 0;
        square_sum.elemsize._0_4_ = 0;
        square_sum.elemsize._4_4_ = 0;
        square_sum.elempack = 0;
        square_sum.dims = 0;
        square_sum.w = 0;
        square_sum.h = 0;
        square_sum.d = 0;
        square_sum.c = 0;
        goto LAB_001f516d;
      }
    }
    iVar26 = this->local_size;
    uVar22 = iVar26 * iVar26;
    fVar1 = this->alpha;
    std::vector<int,_std::allocator<int>_>::vector(&_space_ofs,(ulong)uVar22,&local_179);
    piVar7 = _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pvVar10 = square_sum.data;
    iVar2 = this->local_size;
    if (0 < iVar2) {
      iVar9 = 0;
      iVar11 = 0;
      iVar14 = 0;
      do {
        if (0 < this->local_size) {
          lVar18 = 0;
          do {
            _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_start[iVar14 + lVar18] = iVar11 + (int)lVar18;
            lVar18 = lVar18 + 1;
            iVar17 = (int)lVar18;
          } while (iVar17 < this->local_size);
          iVar14 = iVar14 + iVar17;
          iVar11 = iVar11 + iVar17;
        }
        iVar11 = iVar11 + (uVar13 - iVar2);
        iVar9 = iVar9 + 1;
      } while (iVar9 < this->local_size);
    }
    if (0 < (int)_c) {
      pvVar15 = bottom_top_blob->data;
      sVar3 = bottom_top_blob->cstep;
      lVar16 = (long)square_sum.w;
      lVar18 = CONCAT44(square_sum.elemsize._4_4_,(undefined4)square_sum.elemsize);
      lVar19 = square_sum.cstep * lVar18;
      sVar4 = bottom_top_blob->elemsize;
      local_170 = 0;
      do {
        if (0 < (int)local_178) {
          lVar12 = lVar19 * local_170;
          pvVar24 = (void *)(sVar3 * sVar4 * local_170 + (long)pvVar15);
          local_188 = 0;
          do {
            if (0 < (int)uVar23) {
              uVar20 = 0;
              do {
                if (iVar26 == 0) {
                  fVar28 = 0.0;
                }
                else {
                  fVar28 = 0.0;
                  uVar21 = 0;
                  do {
                    fVar28 = fVar28 + *(float *)((long)pvVar10 +
                                                (long)piVar7[uVar21] * 4 +
                                                uVar20 * 4 + lVar16 * lVar18 * local_188 + lVar12);
                    uVar21 = uVar21 + 1;
                  } while (uVar22 + (uVar22 == 0) != uVar21);
                }
                fVar28 = powf(fVar28 * fVar1 * (1.0 / (float)(int)uVar22) + this->bias,-this->beta);
                *(float *)((long)pvVar24 + uVar20 * 4) =
                     fVar28 * *(float *)((long)pvVar24 + uVar20 * 4);
                uVar20 = uVar20 + 1;
              } while (uVar20 != uVar23);
            }
            pvVar24 = (void *)((long)pvVar24 + (long)(int)uVar23 * 4);
            local_188 = local_188 + 1;
          } while (local_188 != local_178);
        }
        local_170 = local_170 + 1;
      } while (local_170 != uVar25);
    }
    if (_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    piVar6 = (int *)CONCAT44(square_sum.refcount._4_4_,square_sum.refcount._0_4_);
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + -1;
      UNLOCK();
      if (*piVar6 == 0) {
        if (square_sum.allocator == (Allocator *)0x0) {
          if (square_sum.data != (void *)0x0) {
            free(square_sum.data);
          }
        }
        else {
          (*(square_sum.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    square_sum.cstep = 0;
    square_sum.data = (void *)0x0;
    square_sum.refcount._0_4_ = 0;
    square_sum.refcount._4_4_ = 0;
    square_sum.elemsize._0_4_ = 0;
    square_sum.elemsize._4_4_ = 0;
    square_sum.elempack = 0;
    square_sum.dims = 0;
    square_sum.w = 0;
    square_sum.h = 0;
    square_sum.d = 0;
    square_sum.c = 0;
  }
  iVar26 = 0;
LAB_001f516d:
  piVar6 = (int *)CONCAT44(square_blob.refcount._4_4_,square_blob.refcount._0_4_);
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 == 0) {
      if (square_blob.allocator == (Allocator *)0x0) {
        if (square_blob.data != (void *)0x0) {
          free(square_blob.data);
        }
      }
      else {
        (*(square_blob.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar26;
}

Assistant:

int LRN::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    size_t elemsize = bottom_top_blob.elemsize;
    int size = w * h;

    // squared values with local_size padding
    Mat square_blob;
    square_blob.create(w, h, channels, elemsize, opt.workspace_allocator);
    if (square_blob.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = bottom_top_blob.channel(q);
        float* outptr = square_blob.channel(q);

        for (int i = 0; i < size; i++)
        {
            outptr[i] = ptr[i] * ptr[i];
        }
    }

    if (region_type == NormRegion_ACROSS_CHANNELS)
    {
        Mat square_sum;
        square_sum.create(w, h, channels, elemsize, opt.workspace_allocator);
        if (square_sum.empty())
            return -100;
        square_sum.fill(0.f);

        const float alpha_div_size = alpha / local_size;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            // square sum
            float* ssptr = square_sum.channel(q);
            for (int p = q - local_size / 2; p <= q + local_size / 2; p++)
            {
                if (p < 0 || p >= channels)
                    continue;

                const float* sptr = square_blob.channel(p);
                for (int i = 0; i < size; i++)
                {
                    ssptr[i] += sptr[i];
                }
            }

            float* ptr = bottom_top_blob.channel(q);
            for (int i = 0; i < size; i++)
            {
                ptr[i] = static_cast<float>(ptr[i] * pow(bias + alpha_div_size * ssptr[i], -beta));
            }
        }
    }
    else if (region_type == NormRegion_WITHIN_CHANNEL)
    {
        int outw = w;
        int outh = h;

        Mat square_blob_bordered = square_blob;
        int pad = local_size / 2;
        if (pad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            opt_b.use_packing_layout = false;
            copy_make_border(square_blob, square_blob_bordered, pad, local_size - pad - 1, pad, local_size - pad - 1, BORDER_CONSTANT, 0.f, opt_b);
            if (square_blob_bordered.empty())
                return -100;

            w = square_blob_bordered.w;
            h = square_blob_bordered.h;
        }

        const int maxk = local_size * local_size;

        const float alpha_div_size = alpha / maxk;

        // norm window offsets
        std::vector<int> _space_ofs(maxk);
        int* space_ofs = &_space_ofs[0];
        {
            int p1 = 0;
            int p2 = 0;
            int gap = w - local_size;
            for (int i = 0; i < local_size; i++)
            {
                for (int j = 0; j < local_size; j++)
                {
                    space_ofs[p1] = p2;
                    p1++;
                    p2++;
                }
                p2 += gap;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            const Mat m = square_blob_bordered.channel(q);

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    const float* sptr = m.row(i) + j;

                    float ss = 0.f;

                    for (int k = 0; k < maxk; k++)
                    {
                        float val = sptr[space_ofs[k]];
                        ss += val;
                    }

                    ptr[j] = static_cast<float>(ptr[j] * pow(bias + alpha_div_size * ss, -beta));
                }

                ptr += outw;
            }
        }
    }

    return 0;
}